

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O3

void __thiscall
google::protobuf::UnknownFieldSet::MergeFrom(UnknownFieldSet *this,UnknownFieldSet *other)

{
  vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *this_00;
  anon_union_8_5_912831f5_for_data_ aVar1;
  uint32 uVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  UnknownField *__args;
  iterator __position;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  pvVar3 = other->fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     (uVar5 = (uint)((ulong)((long)(pvVar3->
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar3->
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4), 0 < (int)uVar5)
     ) {
    if (this->fields_ ==
        (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
        0x0) {
      pvVar3 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                *)operator_new(0x18);
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->fields_ = pvVar3;
    }
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    lVar4 = 0;
    do {
      this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
                 *)this->fields_;
      __args = (UnknownField *)
               ((long)&((other->fields_->
                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        )._M_impl.super__Vector_impl_data._M_start)->number_ + lVar4);
      __position._M_current = *(UnknownField **)(this_00 + 8);
      if (__position._M_current == *(UnknownField **)(this_00 + 0x10)) {
        std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
        _M_realloc_insert<google::protobuf::UnknownField_const&>(this_00,__position,__args);
      }
      else {
        uVar2 = __args->type_;
        aVar1 = __args->data_;
        (__position._M_current)->number_ = __args->number_;
        (__position._M_current)->type_ = uVar2;
        (__position._M_current)->data_ = aVar1;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
      UnknownField::DeepCopy
                ((this->fields_->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1,__position._M_current);
      lVar4 = lVar4 + 0x10;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

inline int UnknownFieldSet::field_count() const {
  return fields_ ? static_cast<int>(fields_->size()) : 0;
}